

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void * lua_newuserdata(lua_State *L,size_t size)

{
  StkId pTVar1;
  GCObject *pGVar2;
  size_t in_RSI;
  lua_State *in_RDI;
  TValue *i_o;
  Udata *u;
  lua_State *in_stack_ffffffffffffffd0;
  lua_State *e;
  lua_State *in_stack_ffffffffffffffe0;
  
  if (in_RDI->l_G->GCthreshold <= in_RDI->l_G->totalbytes) {
    luaC_step(in_stack_ffffffffffffffd0);
  }
  e = in_RDI;
  getcurrenv(in_RDI);
  pGVar2 = (GCObject *)luaS_newudata(in_stack_ffffffffffffffe0,in_RSI,(Table *)e);
  pTVar1 = in_RDI->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 7;
  in_RDI->top = in_RDI->top + 1;
  return &pGVar2->u + 1;
}

Assistant:

static void*lua_newuserdata(lua_State*L,size_t size){
Udata*u;
luaC_checkGC(L);
u=luaS_newudata(L,size,getcurrenv(L));
setuvalue(L,L->top,u);
api_incr_top(L);
return u+1;
}